

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

bool __thiscall adios2::Engine::BetweenStepPairs(Engine *this)

{
  Engine *pointer;
  bool bVar1;
  string local_40;
  
  pointer = this->m_Engine;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"in call to Engine::BetweenStepPairs","");
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  bVar1 = (bool)adios2::core::Engine::BetweenStepPairs();
  return bVar1;
}

Assistant:

bool Engine::BetweenStepPairs()
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::BetweenStepPairs");
    return m_Engine->BetweenStepPairs();
}